

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

FileSystem * __thiscall
efsw::FileSystem::getLinkRealPath(FileSystem *this,string *dir,string *curPath)

{
  bool bVar1;
  allocator local_bd;
  undefined4 local_bc;
  string local_b8 [32];
  FileSystem local_98 [35];
  undefined1 local_75;
  undefined1 local_68 [8];
  FileInfo fi;
  string *curPath_local;
  string *dir_local;
  string *link;
  
  fi.Inode = (Uint64)curPath;
  dirRemoveSlashAtEnd(dir);
  FileInfo::FileInfo((FileInfo *)local_68,dir,true);
  bVar1 = FileInfo::isLink((FileInfo *)local_68);
  if (bVar1) {
    local_75 = 0;
    FileInfo::linksTo_abi_cxx11_((FileInfo *)this);
    std::__cxx11::string::string(local_b8,(string *)dir);
    pathRemoveFileName(local_98,(string *)local_b8);
    std::__cxx11::string::operator=((string *)fi.Inode,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string(local_b8);
    dirAddSlashAtEnd((string *)this);
    local_75 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_bd);
    std::allocator<char>::~allocator((allocator<char> *)&local_bd);
  }
  local_bc = 1;
  FileInfo::~FileInfo((FileInfo *)local_68);
  return this;
}

Assistant:

std::string FileSystem::getLinkRealPath( std::string dir, std::string& curPath ) {
	FileSystem::dirRemoveSlashAtEnd( dir );
	FileInfo fi( dir, true );

	/// Check with lstat and see if it's a link
	if ( fi.isLink() ) {
		/// get the real path of the link
		std::string link( fi.linksTo() );

		/// get the current path of the directory without the link dir path
		curPath = FileSystem::pathRemoveFileName( dir );

		/// ensure that ends with the os directory slash
		FileSystem::dirAddSlashAtEnd( link );

		return link;
	}

	/// if it's not a link return nothing
	return "";
}